

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::CmdLine(CmdLine *this,string *m,char delim,string *v,bool help)

{
  string *in_RCX;
  undefined1 in_DL;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte in_R8B;
  CmdLine *in_stack_00000160;
  XorHandler *in_stack_ffffffffffffff70;
  allocator<char> *in_stack_ffffffffffffffa0;
  size_type *__s;
  allocator<char> local_22;
  byte local_21;
  string *local_20;
  undefined1 local_11;
  string *local_10;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_11 = in_DL;
  local_10 = in_RSI;
  CmdLineInterface::CmdLineInterface((CmdLineInterface *)in_RDI);
  *(undefined ***)in_RDI = &PTR__CmdLine_00433678;
  __s = &in_RDI->_M_string_length;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI->field_2 + 8) = 0;
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)0x11a21d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,in_stack_ffffffffffffffa0);
  std::allocator<char>::~allocator(&local_22);
  std::__cxx11::string::string((string *)(in_RDI + 2),local_10);
  std::__cxx11::string::string((string *)(in_RDI + 3),local_20);
  *(undefined4 *)(in_RDI + 4) = 0;
  in_RDI[4].field_0x4 = local_11;
  XorHandler::XorHandler(in_stack_ffffffffffffff70);
  *(undefined8 *)(in_RDI + 5) = 0;
  in_RDI[5]._M_string_length = 0;
  in_RDI[5].field_2._M_allocated_capacity = 0;
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)0x11a2f5);
  *(undefined8 *)((long)&in_RDI[5].field_2 + 8) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[6]._M_string_length = 0;
  std::__cxx11::list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>::list
            ((list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_> *)0x11a325);
  in_RDI[6].field_2._M_allocated_capacity = 0;
  in_RDI[6].field_2._M_local_buf[8] = '\x01';
  in_RDI[6].field_2._M_local_buf[9] = '\0';
  in_RDI[6].field_2._M_local_buf[10] = local_21 & 1;
  _constructor(in_stack_00000160);
  return;
}

Assistant:

inline CmdLine::CmdLine(const std::string& m,
                        char delim,
                        const std::string& v,
                        bool help )
    :
  _argList(std::list<Arg*>()),
  _progName("not_set_yet"),
  _message(m),
  _version(v),
  _numRequired(0),
  _delimiter(delim),
  _xorHandler(XorHandler()),
  _argDeleteOnExitList(std::list<Arg*>()),
  _visitorDeleteOnExitList(std::list<Visitor*>()),
  _output(0),
  _handleExceptions(true),
  _userSetOutput(false),
  _helpAndVersion(help)
{
	_constructor();
}